

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

void __thiscall testing::Matcher<mp::PLTerm>::Matcher(Matcher<mp::PLTerm> *this,PLTerm value)

{
  linked_ptr<const_testing::MatcherInterface<mp::PLTerm>_> local_30;
  
  (this->super_MatcherBase<mp::PLTerm>).impl_.value_ = (MatcherInterface<mp::PLTerm> *)0x0;
  (this->super_MatcherBase<mp::PLTerm>).impl_.link_.next_ =
       &(this->super_MatcherBase<mp::PLTerm>).impl_.link_;
  (this->super_MatcherBase<mp::PLTerm>)._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001e19a8
  ;
  local_30.value_ = (MatcherInterface<mp::PLTerm> *)operator_new(0x10);
  ((local_30.value_)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_001e5060;
  local_30.value_[1].super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)
       value.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.impl_;
  local_30.link_.next_ = &local_30.link_;
  internal::linked_ptr<const_testing::MatcherInterface<mp::PLTerm>_>::operator=
            (&(this->super_MatcherBase<mp::PLTerm>).impl_,&local_30);
  internal::linked_ptr<const_testing::MatcherInterface<mp::PLTerm>_>::~linked_ptr(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }